

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void __thiscall CProficiencies::WriteProfs(CProficiencies *this,void *vfp)

{
  size_type sVar1;
  const_reference pvVar2;
  FILE *in_RSI;
  undefined8 *in_RDI;
  int i;
  size_type prof_table_size;
  FILE *fp;
  int local_24;
  
  fprintf(in_RSI,"ProfPoints %d %ld\n",(ulong)*(uint *)(in_RDI + 2),*in_RDI);
  sVar1 = std::size<std::vector<proficiency_type,std::allocator<proficiency_type>>>
                    ((vector<proficiency_type,_std::allocator<proficiency_type>_> *)0x7abb97);
  for (local_24 = 0; (ulong)(long)local_24 < sVar1; local_24 = local_24 + 1) {
    if (-1 < *(int *)((long)in_RDI + (long)local_24 * 4 + 0x14)) {
      pvVar2 = std::vector<proficiency_type,_std::allocator<proficiency_type>_>::operator[]
                         (&prof_table,(long)local_24);
      fprintf(in_RSI,"Prof %s~ %d\n",pvVar2->name,
              (ulong)*(uint *)((long)in_RDI + (long)local_24 * 4 + 0x14));
    }
  }
  return;
}

Assistant:

void CProficiencies::WriteProfs(void *vfp)
{
	FILE *fp = static_cast<FILE *>(vfp);
	fprintf(fp,"ProfPoints %d %ld\n", points, pawardedtime);

	auto prof_table_size = std::size(prof_table);
	for (int i = 0; i < prof_table_size; i++)
	{
		if (profs[i] > -1)
			fprintf(fp, "Prof %s~ %d\n", prof_table[i].name, profs[i]);
	}
}